

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expansion.cpp
# Opt level: O1

void expand_(PadParseMessageBlock *m,int pad_parse_block_count,ExpansionBlock *ws,int *ws_count)

{
  _WordT *p_Var1;
  _WordT *p_Var2;
  _WordT *p_Var3;
  ExpansionBlock EVar4;
  ExpansionBlock EVar5;
  ExpansionBlock EVar6;
  ExpansionBlock EVar7;
  ExpansionBlock EVar8;
  ExpansionBlock EVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ExpansionBlock *pEVar18;
  ExpansionBlock *pEVar19;
  ulong uVar20;
  PadParseMessageBlock mi;
  _WordT local_78 [4];
  _WordT local_58;
  _WordT _Stack_50;
  _WordT local_48;
  _WordT _Stack_40;
  
  *ws_count = pad_parse_block_count << 6;
  if (0 < pad_parse_block_count) {
    pEVar18 = ws + 0x10;
    uVar12 = 0;
    uVar20 = 0;
    pEVar19 = ws;
    do {
      uVar13 = (ulong)((uint)uVar12 & 0x3ffffff);
      p_Var1 = m[uVar12].super__Base_bitset<8UL>._M_w + 2;
      p_Var2 = m[uVar12].super__Base_bitset<8UL>._M_w + 4;
      p_Var3 = m[uVar12].super__Base_bitset<8UL>._M_w + 6;
      local_48 = *p_Var3;
      _Stack_40 = p_Var3[1];
      local_58 = *p_Var2;
      _Stack_50 = p_Var2[1];
      local_78[2] = *p_Var1;
      local_78[3] = p_Var1[1];
      local_78[0] = m[uVar12].super__Base_bitset<8UL>._M_w[0];
      local_78[1] = m[uVar12].super__Base_bitset<8UL>._M_w[1];
      lVar10 = 0x1ff;
      bVar11 = 0x20;
      lVar14 = 0;
      do {
        lVar15 = 0;
        do {
          uVar16 = (ulong)((int)lVar15 + 0x1f);
          uVar17 = uVar20 | 1L << (uVar16 & 0x3f);
          uVar20 = uVar20 & ~(1L << (uVar16 & 0x3f));
          if ((local_78[(ulong)(lVar10 + lVar15) >> 6] >>
               ((ulong)((bVar11 & 0x3f) + 0x1f + (int)lVar15) & 0x3f) & 1) != 0) {
            uVar20 = uVar17;
          }
          lVar15 = lVar15 + -1;
        } while (lVar15 != -0x20);
        ws[uVar12 + lVar14].super__Base_bitset<1UL>._M_w = uVar20;
        lVar14 = lVar14 + 1;
        lVar10 = lVar10 + -0x20;
        bVar11 = bVar11 + 0x20;
      } while (lVar14 != 0x10);
      lVar10 = 0;
      do {
        EVar4 = rot(0x11,(ExpansionBlock)ws[uVar13 * 0x40 + lVar10 + 4].super__Base_bitset<1UL>._M_w
                   );
        EVar5 = rot(0xe,(ExpansionBlock)ws[uVar13 * 0x40 + lVar10 + 4].super__Base_bitset<1UL>._M_w)
        ;
        EVar6 = shf(0xc,(ExpansionBlock)ws[uVar13 * 0x40 + lVar10 + 4].super__Base_bitset<1UL>._M_w)
        ;
        EVar7 = rot(9,(ExpansionBlock)ws[uVar13 * 0x40 + lVar10 + 0xf].super__Base_bitset<1UL>._M_w)
        ;
        EVar8 = rot(0x13,(ExpansionBlock)
                         ws[uVar13 * 0x40 + lVar10 + 0xf].super__Base_bitset<1UL>._M_w);
        EVar9 = shf(9,(ExpansionBlock)ws[uVar13 * 0x40 + lVar10 + 0xf].super__Base_bitset<1UL>._M_w)
        ;
        uVar20 = (ulong)(((uint)EVar6.super__Base_bitset<1UL>._M_w ^
                         (uint)EVar5.super__Base_bitset<1UL>._M_w ^
                         (uint)EVar4.super__Base_bitset<1UL>._M_w) +
                         (int)ws[uVar13 * 0x40 + lVar10 + 10].super__Base_bitset<1UL>._M_w +
                         ((uint)EVar9.super__Base_bitset<1UL>._M_w ^
                         (uint)EVar8.super__Base_bitset<1UL>._M_w ^
                         (uint)EVar7.super__Base_bitset<1UL>._M_w) +
                        (int)ws[uVar13 * 0x40 + lVar10 + 1].super__Base_bitset<1UL>._M_w);
        pEVar18[lVar10].super__Base_bitset<1UL>._M_w = uVar20;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x30);
      lVar10 = 0;
      do {
        EVar4 = permutationBox((ExpansionBlock)pEVar19[lVar10].super__Base_bitset<1UL>._M_w);
        pEVar19[lVar10].super__Base_bitset<1UL>._M_w = (_WordT)EVar4.super__Base_bitset<1UL>._M_w;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x40);
      uVar12 = uVar12 + 1;
      pEVar18 = pEVar18 + 1;
      pEVar19 = pEVar19 + 1;
    } while (uVar12 != (uint)pad_parse_block_count);
  }
  return;
}

Assistant:

void expand_(PadParseMessageBlock *m, int pad_parse_block_count, ExpansionBlock *ws, int &ws_count)
{
    ws_count = 64 * pad_parse_block_count;
    int ws_iterator = 0;
    ExpansionBlock eb, s1, s0;

    for (int j = 0; j < pad_parse_block_count; ++j) {
        PadParseMessageBlock mi = m[j];

        for (int i = 0; i < EXPANSION_CHUNK_NUM; i++) { // making first 16 Wt
            for (int j = 0; j < EXPANSION_BLOCK_SIZE; j++) {
                eb[EXPANSION_BLOCK_SIZE - 1 - j] = mi[PAD_PARSE_BLOCK_SIZE - 1 - (i * 32) - j];
            }

            ws[ws_iterator + i] = eb;
        }

        for (int i = 16; i < EXPANSION_BLOCK_COUNT_IN_SET; i++) { // making other 64 Wt
            s0 = rot(17, ws[64 * ws_iterator + i - 12]) ^ rot(14, ws[64 * ws_iterator + i - 12]) ^ shf(12, ws[64 * ws_iterator + i - 12]);
            s1 = rot(9, ws[64 * ws_iterator + i - 1]) ^ rot(19, ws[64 * ws_iterator + i - 1]) ^ shf(9, ws[64 * ws_iterator + i - 1]);
            eb = s1.to_ulong() + ws[64 * ws_iterator + i - 6].to_ulong() + s0.to_ulong() + ws[64 * ws_iterator + i - 15].to_ulong();

            ws[ws_iterator + i] = eb;
        }

        for (int i = 0; i < EXPANSION_BLOCK_COUNT_IN_SET; i++) { // permuting the blocks
            ws[ws_iterator + i] = permutationBox(ws[ws_iterator + i]);
        }

        ws_iterator++;
    }
}